

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

int mcpl_skipforward(mcpl_file_t ff,uint64_t n)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  uVar1 = *(ulong *)((long)ff.internal + 0x40);
  if ((n < uVar1) && (*(ulong *)((long)ff.internal + 0x88) < uVar1)) {
    uVar4 = *(ulong *)((long)ff.internal + 0x88) + n;
    *(ulong *)((long)ff.internal + 0x88) = uVar4;
    bVar6 = uVar4 < uVar1;
    if (uVar4 <= uVar1) {
      if (n != 0 && bVar6) {
        if (*(long *)((long)ff.internal + 8) == 0) {
          iVar2 = fseek(*ff.internal,*(uint *)((long)ff.internal + 0x78) * n,1);
          if (iVar2 != 0) goto LAB_00104b35;
        }
        else {
          lVar5 = uVar4 * *(uint *)((long)ff.internal + 0x78) + *(long *)((long)ff.internal + 0x80);
          lVar3 = gzseek64(*(long *)((long)ff.internal + 8),lVar5,0);
          if (lVar3 != lVar5) {
LAB_00104b35:
            (*mcpl_error_handler)("Errors encountered while skipping in particle list");
            printf("MCPL ERROR: %s\n",
                   "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!"
                  );
            exit(1);
          }
        }
      }
      goto LAB_00104ad0;
    }
  }
  *(ulong *)((long)ff.internal + 0x88) = uVar1;
  bVar6 = false;
LAB_00104ad0:
  return (int)bVar6;
}

Assistant:

int mcpl_skipforward(mcpl_file_t ff,uint64_t n)
{
  MCPLIMP_FILEDECODE;
  //increment, but guard against overflows:
  if ( n >= f->nparticles || f->current_particle_idx >= f->nparticles )
    f->current_particle_idx = f->nparticles;
  else
    f->current_particle_idx += n;
  if ( f->current_particle_idx > f->nparticles )
    f->current_particle_idx = f->nparticles;

  int notEOF = f->current_particle_idx<f->nparticles;
  if (n==0)
    return notEOF;
  if (notEOF) {
    int error;
    if (f->filegz) {
      int64_t targetpos = f->current_particle_idx*f->particle_size+f->first_particle_pos;
      error = ! mcpl_gzseek(f->filegz, targetpos );
    } else {
      error = MCPL_FSEEK_CUR( f->file, f->particle_size * n )!=0;
    }
    if (error)
      mcpl_error("Errors encountered while skipping in particle list");
  }
  return notEOF;
}